

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_input_unmark(mpc_input_t *i)

{
  mpc_state_t *pmVar1;
  char *pcVar2;
  size_t sVar3;
  int local_1c;
  int local_14;
  int j;
  mpc_input_t *i_local;
  
  if (0 < i->backtrack) {
    i->marks_num = i->marks_num + -1;
    if ((i->marks_num + i->marks_num / 2 < i->marks_slots) && (0x20 < i->marks_slots)) {
      if (i->marks_num < 0x21) {
        local_1c = 0x20;
      }
      else {
        local_1c = i->marks_num;
      }
      i->marks_slots = local_1c;
      pmVar1 = (mpc_state_t *)realloc(i->marks,(long)i->marks_slots << 5);
      i->marks = pmVar1;
      pcVar2 = (char *)realloc(i->lasts,(long)i->marks_slots);
      i->lasts = pcVar2;
    }
    if ((i->type == 2) && (i->marks_num == 0)) {
      sVar3 = strlen(i->buffer);
      local_14 = (int)sVar3;
      while (local_14 = local_14 + -1, -1 < local_14) {
        ungetc((int)i->buffer[local_14],(FILE *)i->file);
      }
      free(i->buffer);
      i->buffer = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void mpc_input_unmark(mpc_input_t *i) {
  int j;

  if (i->backtrack < 1) { return; }

  i->marks_num--;

  if (i->marks_slots > i->marks_num + i->marks_num / 2
  &&  i->marks_slots > MPC_INPUT_MARKS_MIN) {
    i->marks_slots =
      i->marks_num > MPC_INPUT_MARKS_MIN ?
      i->marks_num : MPC_INPUT_MARKS_MIN;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 0) {
    for (j = strlen(i->buffer) - 1; j >= 0; j--)
      ungetc(i->buffer[j], i->file);

    free(i->buffer);
    i->buffer = NULL;
  }

}